

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_naive_matches_jmp_::
~Test_bitileave_ileaveBytes_naive_matches_jmp_(Test_bitileave_ileaveBytes_naive_matches_jmp_ *this)

{
  Test::~Test(&this->super_Test);
  operator_delete(this,0x18);
  return;
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_naive_matches_jmp)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint64_t bytesAsInt = distr(rng);

        std::uint64_t jmp = detail::ileaveBytes_jmp(bytesAsInt, i % 9);
        std::uint64_t naive = detail::ileaveBytes_naive(bytesAsInt, i % 9);
        BITMANIP_ASSERT_EQ(jmp, naive);
    }
}